

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckForStyleAttribute(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  AttVal *av;
  AttVal *style;
  Node *content;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  BVar1 = Level1_Enabled(doc);
  if (BVar1 != no) {
    av = prvTidyAttrGetById(node,TidyAttr_STYLE);
    BVar1 = hasValue(av);
    if (BVar1 != no) {
      prvTidyReportAccessError(doc,node,0x2d3);
    }
  }
  for (style = (AttVal *)node->content; style != (AttVal *)0x0; style = (AttVal *)style->asp) {
    CheckForStyleAttribute(doc,(Node *)style);
  }
  return;
}

Assistant:

static void CheckForStyleAttribute( TidyDocImpl* doc, Node* node )
{
    Node* content;
    if (Level1_Enabled( doc ))
    {
        /* Must not contain 'STYLE' attribute */
        AttVal* style = attrGetSTYLE( node );
        if ( hasValue(style) )
        {
            TY_(ReportAccessError)( doc, node, STYLESHEETS_REQUIRE_TESTING_STYLE_ATTR );
        }
    }

    /* Recursively check all child nodes.
    */
    for ( content = node->content; content != NULL; content = content->next )
        CheckForStyleAttribute( doc, content );
}